

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

Abc_Des_t * Abc_DesDup(Abc_Des_t *p)

{
  int iVar1;
  Abc_Des_t *p_00;
  Abc_Ntk_t *pAVar2;
  void *pvVar3;
  Abc_Obj_t *pObj_00;
  Abc_Ntk_t *pAVar4;
  undefined8 local_58;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pTemp;
  Abc_Des_t *pNew;
  Abc_Des_t *p_local;
  
  p_00 = Abc_DesCreate(p->pName);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vModules), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,local_2c);
    pAVar2 = Abc_NtkDup(pAVar2);
    Abc_DesAddModel(p_00,pAVar2);
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vTops), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar3 = Vec_PtrEntry(p->vTops,local_2c);
    Vec_PtrPush(p_00->vTops,*(void **)((long)pvVar3 + 0x160));
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vModules), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar3 = Vec_PtrEntry(p->vModules,local_2c);
    if (*(long *)((long)pvVar3 + 0xb8) == 0) {
      local_58 = 0;
    }
    else {
      local_58 = *(undefined8 *)(*(long *)((long)pvVar3 + 0xb8) + 0x160);
    }
    *(undefined8 *)(*(long *)((long)pvVar3 + 0x160) + 0xb8) = local_58;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vModules), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,local_2c);
    for (local_30 = 0; iVar1 = Vec_PtrSize(pAVar2->vBoxes), local_30 < iVar1;
        local_30 = local_30 + 1) {
      pObj_00 = Abc_NtkBox(pAVar2,local_30);
      iVar1 = Abc_ObjIsWhitebox(pObj_00);
      if ((iVar1 != 0) || (iVar1 = Abc_ObjIsBlackbox(pObj_00), iVar1 != 0)) {
        pAVar4 = Abc_ObjModel(pObj_00);
        ((pObj_00->field_6).pCopy)->field_5 =
             (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar4->pCopy;
      }
    }
  }
  return p_00;
}

Assistant:

Abc_Des_t * Abc_DesDup( Abc_Des_t * p )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pTemp;
    Abc_Obj_t * pObj;
    int i, k;
    pNew = Abc_DesCreate( p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_DesAddModel( pNew, Abc_NtkDup(pTemp) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vTops, pTemp, i )
        Vec_PtrPush( pNew->vTops, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    return pNew;
}